

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

void encodeString(VM vm,Value value)

{
  String str;
  ulong uVar1;
  
  if (vm->error_code != 0) {
    return;
  }
  writeCommand(vm,Snew);
  uVar1 = 0;
  while ((uVar1 < (value.s)->length && (vm->error_code == 0))) {
    encodeInt(vm,(Value)(long)(value.s)->data[uVar1]);
    writeCommand(vm,Sadd);
    uVar1 = uVar1 + 1;
  }
  return;
}

Assistant:

void encodeString(VM vm, Value value) {
    String str = value.s;
    size_t i;
    if (vm->error_code)return;
    writeCommand(vm, Snew);
    for (i = 0; i < str->length; i++) {
        if (vm->error_code)return;
        Value v;
        v.i = str->data[i];
        encodeInt(vm, v);
        writeCommand(vm, Sadd);
    }
}